

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modifiers.cpp
# Opt level: O2

void __thiscall Modifiers_Init_Test::TestBody(Modifiers_Init_Test *this)

{
  pointer *__ptr;
  _List_node_base *message;
  char *message_00;
  AssertHelper local_188;
  AssertionResult gtest_ar_1;
  AssertHelper local_170;
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  opt_b;
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  opt_a;
  
  opt_b.super_option._vptr_option = (_func_int **)&gtest_ar_1;
  gtest_ar_1._0_8_ = gtest_ar_1._0_8_ & 0xffffffff00000000;
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
  ::opt<pstore::command_line::details::initializer<(anonymous_namespace)::enumeration>>
            ((opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
              *)&opt_a,(initializer<(anonymous_namespace)::enumeration> *)&opt_b);
  gtest_ar_1._0_8_ = gtest_ar_1._0_8_ & 0xffffffff00000000;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
            ((EqHelper *)&opt_b,"opt_a.get ()","enumeration::a",&opt_a.value_,
             (enumeration *)&gtest_ar_1);
  if ((char)opt_b.super_option._vptr_option == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (opt_b.super_option.container_pos_._M_node == (_List_node_base *)0x0) {
      message = (_List_node_base *)0x165d88;
    }
    else {
      message = (opt_b.super_option.container_pos_._M_node)->_M_next;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,0x39,(char *)message);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&opt_b.super_option.container_pos_);
  local_188.data_._0_4_ = 1;
  gtest_ar_1._0_8_ = &local_188;
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
  ::opt<pstore::command_line::details::initializer<(anonymous_namespace)::enumeration>>
            ((opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
              *)&opt_b,(initializer<(anonymous_namespace)::enumeration> *)&gtest_ar_1);
  local_188.data_._0_4_ = 1;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
            ((EqHelper *)&gtest_ar_1,"opt_b.get ()","enumeration::b",&opt_b.value_,
             (enumeration *)&local_188);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_188);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message_00 = "";
    }
    else {
      message_00 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,0x3c,message_00);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if ((long *)CONCAT44(local_188.data_._4_4_,local_188.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_188.data_._4_4_,local_188.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  ::~opt(&opt_b);
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  ::~opt(&opt_a);
  return;
}

Assistant:

TEST_F (Modifiers, Init) {
    // init() allows the initial (default) value of the option to be described.
    opt<enumeration> opt_a (init (enumeration::a));

    EXPECT_EQ (opt_a.get (), enumeration::a);

    opt<enumeration> opt_b (init (enumeration::b));
    EXPECT_EQ (opt_b.get (), enumeration::b);
}